

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicorn.c
# Opt level: O1

uc_err reg_read_sparc(void *_env,int mode,uint regid,void *value,size_t *size)

{
  uc_err uVar1;
  CPUSPARCState *env;
  undefined4 *puVar2;
  
  if (regid - 0x35 < 8) {
    if (*size < 4) {
      return UC_ERR_OVERFLOW;
    }
    *size = 4;
    puVar2 = (undefined4 *)((long)_env + (ulong)(regid - 0x35) * 4);
  }
  else if (regid - 0x4e < 8) {
    if (*size < 4) {
      return UC_ERR_OVERFLOW;
    }
    *size = 4;
    puVar2 = (undefined4 *)(*(long *)((long)_env + 0x20) + (ulong)regid * 4 + -0x138);
  }
  else if (regid - 0x46 < 8) {
    if (*size < 4) {
      return UC_ERR_OVERFLOW;
    }
    *size = 4;
    puVar2 = (undefined4 *)(*(long *)((long)_env + 0x20) + (ulong)regid * 4 + -0xf8);
  }
  else {
    if (regid - 0x3d < 8) {
      puVar2 = (undefined4 *)(*(long *)((long)_env + 0x20) + (ulong)regid * 4 + -0xb4);
      uVar1 = UC_ERR_ARG;
      goto LAB_004b8ad2;
    }
    if (regid != 0x58) {
      return UC_ERR_ARG;
    }
    if (*size < 4) {
      return UC_ERR_OVERFLOW;
    }
    *size = 4;
    puVar2 = (undefined4 *)((long)_env + 0x28);
  }
  uVar1 = UC_ERR_OK;
LAB_004b8ad2:
  *(undefined4 *)value = *puVar2;
  return uVar1;
}

Assistant:

DEFAULT_VISIBILITY
uc_err reg_read(void *_env, int mode, unsigned int regid, void *value,
                size_t *size)
{
    CPUSPARCState *env = _env;
    uc_err ret = UC_ERR_ARG;

    if (regid >= UC_SPARC_REG_G0 && regid <= UC_SPARC_REG_G7) {
        CHECK_REG_TYPE(uint32_t);
        *(uint32_t *)value = env->gregs[regid - UC_SPARC_REG_G0];
    } else if (regid >= UC_SPARC_REG_O0 && regid <= UC_SPARC_REG_O7) {
        CHECK_REG_TYPE(uint32_t);
        *(uint32_t *)value = env->regwptr[regid - UC_SPARC_REG_O0];
    } else if (regid >= UC_SPARC_REG_L0 && regid <= UC_SPARC_REG_L7) {
        CHECK_REG_TYPE(uint32_t);
        *(uint32_t *)value = env->regwptr[8 + regid - UC_SPARC_REG_L0];
    } else if (regid >= UC_SPARC_REG_I0 && regid <= UC_SPARC_REG_I7) {
        *(uint32_t *)value = env->regwptr[16 + regid - UC_SPARC_REG_I0];
    } else {
        switch (regid) {
        default:
            break;
        case UC_SPARC_REG_PC:
            CHECK_REG_TYPE(uint32_t);
            *(uint32_t *)value = env->pc;
            break;
        }
    }

    return ret;
}